

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QCborArray __thiscall QCborValue::toArray(QCborValue *this)

{
  QCborArray *in_RSI;
  long in_FS_OFFSET;
  QCborArray QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QCborArray::QCborArray(&QStack_28);
  toArray(this,in_RSI);
  QCborArray::~QCborArray(&QStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QCborArray QCborValue::toArray() const
{
    return toArray(QCborArray());
}